

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeI8x16Const
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,array<unsigned_char,_16UL> *vals)

{
  byte *pbVar1;
  reference this_00;
  Literal local_220;
  Result<wasm::Ok> local_208;
  Literal local_1d0;
  ulong local_1b8;
  size_t i;
  array<wasm::Literal,_16UL> lanes;
  array<unsigned_char,_16UL> *vals_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *this_local;
  
  lanes._M_elems[0xf].type.id = (uintptr_t)vals;
  std::array<wasm::Literal,_16UL>::array((array<wasm::Literal,_16UL> *)&i);
  for (local_1b8 = 0; local_1b8 < 0x10; local_1b8 = local_1b8 + 1) {
    pbVar1 = std::array<unsigned_char,_16UL>::operator[]
                       ((array<unsigned_char,_16UL> *)lanes._M_elems[0xf].type.id,local_1b8);
    wasm::Literal::Literal(&local_1d0,(uint)*pbVar1);
    this_00 = std::array<wasm::Literal,_16UL>::operator[]
                        ((array<wasm::Literal,_16UL> *)&i,local_1b8);
    wasm::Literal::operator=(this_00,&local_1d0);
    wasm::Literal::~Literal(&local_1d0);
  }
  wasm::Literal::Literal(&local_220,(LaneArray<16> *)&i);
  IRBuilder::makeConst(&local_208,&this->irBuilder,&local_220);
  withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,&local_208);
  Result<wasm::Ok>::~Result(&local_208);
  wasm::Literal::~Literal(&local_220);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)&i);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeI8x16Const(Index pos,
                          const std::vector<Annotation>& annotations,
                          const std::array<uint8_t, 16>& vals) {
    std::array<Literal, 16> lanes;
    for (size_t i = 0; i < 16; ++i) {
      lanes[i] = Literal(uint32_t(vals[i]));
    }
    return withLoc(pos, irBuilder.makeConst(Literal(lanes)));
  }